

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool
replace_item_in_object(cJSON *object,char *string,cJSON *replacement,cJSON_bool case_sensitive)

{
  byte *pbVar1;
  cJSON_bool cVar2;
  undefined8 in_RAX;
  size_t sVar3;
  char *__dest;
  cJSON *item;
  
  if (string == (char *)0x0 || replacement == (cJSON *)0x0) {
    return (cJSON_bool)CONCAT71((int7)((ulong)in_RAX >> 8),replacement == (cJSON *)0x0);
  }
  if (((replacement->type & 0x200) == 0) && (replacement->string != (char *)0x0)) {
    (*global_hooks.deallocate)(replacement->string);
  }
  sVar3 = strlen(string);
  __dest = (char *)(*global_hooks.allocate)(sVar3 + 1);
  if (__dest != (char *)0x0) {
    memcpy(__dest,string,sVar3 + 1);
  }
  replacement->string = __dest;
  pbVar1 = (byte *)((long)&replacement->type + 1);
  *pbVar1 = *pbVar1 & 0xfd;
  item = get_object_item(object,string,case_sensitive);
  cVar2 = cJSON_ReplaceItemViaPointer(object,item,replacement);
  return cVar2;
}

Assistant:

static cJSON_bool replace_item_in_object(cJSON *object, const char *string, cJSON *replacement, cJSON_bool case_sensitive)
{
    if ((replacement == NULL) || (string == NULL))
    {
        return false;
    }

    /* replace the name in the replacement */
    if (!(replacement->type & cJSON_StringIsConst) && (replacement->string != NULL))
    {
        cJSON_free(replacement->string);
    }
    replacement->string = (char*)cJSON_strdup((const unsigned char*)string, &global_hooks);
    replacement->type &= ~cJSON_StringIsConst;

    cJSON_ReplaceItemViaPointer(object, get_object_item(object, string, case_sensitive), replacement);

    return true;
}